

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  byte *z;
  char zBuf [32];
  DateTime x;
  byte local_68;
  byte local_67;
  byte local_66;
  byte local_65;
  byte local_64;
  undefined1 local_63;
  char local_62;
  char local_61;
  undefined1 local_60;
  char local_5f;
  char local_5e;
  undefined1 local_5d;
  char local_5c;
  char local_5b;
  undefined1 local_5a;
  char local_59;
  char local_58;
  undefined1 local_57;
  char local_56;
  char local_55;
  undefined1 local_54;
  char local_53;
  char local_52;
  char local_51;
  undefined1 local_50;
  DateTime local_40;
  
  z = &local_68;
  iVar3 = isDate(context,argc,argv,&local_40);
  if (iVar3 == 0) {
    computeYMD(&local_40);
    computeHMS(&local_40);
    uVar1 = -local_40.Y;
    if (0 < local_40.Y) {
      uVar1 = local_40.Y;
    }
    uVar5 = (ulong)uVar1;
    local_67 = (char)(uVar1 / 1000) + (char)((uVar5 / 1000) * 0x1999999a >> 0x20) * -10 | 0x30;
    local_66 = (char)(uVar1 / 100) + (char)((uVar5 / 100) * 0x1999999a >> 0x20) * -10 | 0x30;
    cVar2 = (char)(uVar1 / 10);
    local_65 = cVar2 + (char)((uVar5 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
    local_64 = (char)uVar1 + (cVar2 + (char)(uVar1 / 10)) * -5 | 0x30;
    local_63 = 0x2d;
    cVar2 = (char)(local_40.M / 10);
    local_62 = cVar2 + (char)((local_40.M / 10) / 10) * -10 + '0';
    local_61 = (char)local_40.M + cVar2 * -10 + '0';
    local_60 = 0x2d;
    cVar2 = (char)(local_40.D / 10);
    local_5f = cVar2 + (char)((local_40.D / 10) / 10) * -10 + '0';
    local_5e = (char)local_40.D + cVar2 * -10 + '0';
    local_5d = 0x20;
    cVar2 = (char)(local_40.h / 10);
    local_5c = cVar2 + (char)((local_40.h / 10) / 10) * -10 + '0';
    local_5b = (char)local_40.h + cVar2 * -10 + '0';
    local_5a = 0x3a;
    cVar2 = (char)(local_40.m / 10);
    local_59 = cVar2 + (char)((local_40.m / 10) / 10) * -10 + '0';
    local_58 = (char)local_40.m + cVar2 * -10 + '0';
    local_57 = 0x3a;
    if ((local_40._44_1_ & 4) == 0) {
      iVar3 = (int)local_40.s / 10;
      local_56 = (char)iVar3 +
                 ((char)(uint)((ulong)((long)iVar3 * 0x66666667) >> 0x22) - (char)(iVar3 >> 0x1f)) *
                 -10;
      local_55 = (char)(int)local_40.s + (char)iVar3 * -10;
      local_54 = 0;
      iVar3 = 0x14;
    }
    else {
      iVar4 = (int)(local_40.s * 1000.0 + 0.5);
      iVar3 = iVar4 / 10000;
      local_56 = (char)iVar3 +
                 ((char)(uint)((ulong)((long)iVar3 * 0x66666667) >> 0x22) - (char)(iVar3 >> 0x1f)) *
                 -10;
      iVar3 = iVar4 / 1000;
      local_55 = (char)iVar3 +
                 ((char)(uint)((ulong)((long)iVar3 * 0x66666667) >> 0x22) - (char)(iVar3 >> 0x1f)) *
                 -10;
      local_54 = 0x2e;
      iVar3 = iVar4 / 100;
      local_53 = (char)iVar3 +
                 ((char)(uint)((ulong)((long)iVar3 * 0x66666667) >> 0x22) - (char)(iVar3 >> 0x1f)) *
                 -10 + '0';
      iVar3 = iVar4 / 10;
      local_52 = (char)iVar3 +
                 ((char)(uint)((ulong)((long)iVar3 * 0x66666667) >> 0x22) - (char)(iVar3 >> 0x1f)) *
                 -10 + '0';
      local_51 = (char)iVar4 + (char)iVar3 * -10 + '0';
      local_50 = 0;
      iVar3 = 0x18;
    }
    local_55 = local_55 + '0';
    local_56 = local_56 + '0';
    if (local_40.Y < 0) {
      local_68 = 0x2d;
    }
    else {
      z = &local_67;
      iVar3 = iVar3 + -1;
    }
    setResultStrOrError(context,(char *)z,iVar3,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s, n;
    char zBuf[32];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[18] = '0' + (s/10000)%10;
      zBuf[19] = '0' + (s/1000)%10;
      zBuf[20] = '.';
      zBuf[21] = '0' + (s/100)%10;
      zBuf[22] = '0' + (s/10)%10;
      zBuf[23] = '0' + (s)%10;
      zBuf[24] = 0;
      n = 24;
    }else{
      s = (int)x.s;
      zBuf[18] = '0' + (s/10)%10;
      zBuf[19] = '0' + (s)%10;
      zBuf[20] = 0;
      n = 20;
    }
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], n-1, SQLITE_TRANSIENT);
    }
  }
}